

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O0

void pop_symbol_scope(Context_conflict *ctx,SymbolMap *map)

{
  bool bVar1;
  SymbolMap *map_local;
  Context_conflict *ctx_local;
  
  while( true ) {
    bVar1 = false;
    if (map->scope != (SymbolScope *)0x0) {
      bVar1 = map->scope->symbol != (char *)0x0;
    }
    if (!bVar1) break;
    pop_symbol(ctx,map);
  }
  if (map->scope != (SymbolScope *)0x0) {
    if (map->scope->symbol == (char *)0x0) {
      pop_symbol(ctx,map);
      return;
    }
    __assert_fail("map->scope->symbol == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                  ,0x1e9,"void pop_symbol_scope(Context *, SymbolMap *)");
  }
  __assert_fail("map->scope != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                ,0x1e8,"void pop_symbol_scope(Context *, SymbolMap *)");
}

Assistant:

static void pop_symbol_scope(Context *ctx, SymbolMap *map)
{
    while ((map->scope) && (map->scope->symbol))
        pop_symbol(ctx, map);

    assert(map->scope != NULL);
    assert(map->scope->symbol == NULL);
    pop_symbol(ctx, map);
}